

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::str_format_internal::LengthModToString_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,LengthMod v)

{
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  undefined1 local_11;
  string *psStack_10;
  LengthMod v_local;
  
  local_11 = SUB81(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"h",&local_12);
    std::allocator<char>::~allocator(&local_12);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"hh",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"l",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ll",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"L",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"j",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"z",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"t",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"q",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LengthModToString(LengthMod v) {
  switch (v) {
    case LengthMod::h:
      return "h";
    case LengthMod::hh:
      return "hh";
    case LengthMod::l:
      return "l";
    case LengthMod::ll:
      return "ll";
    case LengthMod::L:
      return "L";
    case LengthMod::j:
      return "j";
    case LengthMod::z:
      return "z";
    case LengthMod::t:
      return "t";
    case LengthMod::q:
      return "q";
    case LengthMod::none:
      return "";
  }
  return "";
}